

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O1

void __thiscall
capnp::_::anon_unknown_0::TestRpcEnv::TestRpcEnv
          (TestRpcEnv *this,Maybe<kj::Promise<void>_> *revokePromise)

{
  AsyncIoStream *connection;
  _func_int *p_Var1;
  Connection CVar2;
  WindowGetter WVar3;
  undefined8 uVar4;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 node;
  ClientHook *pCVar5;
  MembranePolicy *pMVar6;
  Refcounted *refcounted;
  Client CVar7;
  undefined1 local_b8 [8];
  Connection local_b0;
  WindowGetter local_a8;
  undefined1 local_a0 [16];
  Maybe<kj::Promise<void>_> local_90;
  Own<capnp::MembranePolicy,_std::nullptr_t> local_80;
  Client local_70;
  char *local_60;
  char *pcStack_58;
  void *local_50;
  TwoWayPipe *local_48;
  OwnPromiseNode local_40;
  ArrayDisposer *local_38;
  
  kj::EventLoop::EventLoop(&this->loop);
  (this->waitScope).loop = &this->loop;
  (this->waitScope).busyPollInterval = 0xffffffff;
  (this->waitScope).fiber.ptr = (FiberBase *)0x0;
  (this->waitScope).runningStacksPool.ptr = (FiberPool *)0x0;
  kj::EventLoop::enterScope(&this->loop);
  local_48 = &this->pipe;
  kj::newTwoWayPipe();
  TwoPartyClient::TwoPartyClient(&this->client,(this->pipe).ends[0].ptr);
  connection = (this->pipe).ends[1].ptr;
  local_a0._8_8_ = operator_new(0x18);
  (((TestMembraneImpl *)local_a0._8_8_)->super_Server)._vptr_Server = (_func_int **)0x0;
  *(undefined8 *)&(((TestMembraneImpl *)local_a0._8_8_)->super_Server).field_0x8 = 0;
  *(undefined8 *)&(((TestMembraneImpl *)local_a0._8_8_)->super_Server).field_0x10 = 0;
  (((TestMembraneImpl *)local_a0._8_8_)->super_Server)._vptr_Server = (_func_int **)0x6e2600;
  *(undefined8 *)&(((TestMembraneImpl *)local_a0._8_8_)->super_Server).field_0x8 = 0x6e2658;
  local_a0._0_8_ = &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestMembraneImpl>::instance
  ;
  pMVar6 = (MembranePolicy *)operator_new(0xc0);
  kj::Maybe<kj::Promise<void>_>::Maybe(&local_90,revokePromise);
  (pMVar6->wrappers).table.rows.builder.ptr = (Entry *)0x0;
  (pMVar6->wrappers).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *)0x0;
  (pMVar6->wrappers).table.rows.builder.endPtr = (Entry *)0x0;
  (pMVar6->wrappers).table.rows.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance
  ;
  (pMVar6->wrappers).table.indexes.erasedCount = 0;
  (pMVar6->wrappers).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (pMVar6->wrappers).table.indexes.buckets.size_ = 0;
  (pMVar6->wrappers).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (pMVar6->reverseWrappers).table.rows.builder.ptr = (Entry *)0x0;
  (pMVar6->reverseWrappers).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *)0x0;
  (pMVar6->reverseWrappers).table.rows.builder.endPtr = (Entry *)0x0;
  (pMVar6->reverseWrappers).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (pMVar6->reverseWrappers).table.indexes.erasedCount = 0;
  (pMVar6->reverseWrappers).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (pMVar6->reverseWrappers).table.indexes.buckets.size_ = 0;
  (pMVar6->reverseWrappers).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  *(undefined4 *)&pMVar6[1].wrappers.table.rows.builder.ptr = 0;
  pMVar6->_vptr_MembranePolicy = (_func_int **)&PTR_inboundCall_006e23f0;
  pMVar6[1]._vptr_MembranePolicy = (_func_int **)&PTR_disposeImpl_006e2468;
  if (local_90.ptr.isSet == false) {
    *(undefined1 *)&pMVar6[1].wrappers.table.rows.builder.pos = 0;
  }
  else {
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++"
    ;
    pcStack_58 = "operator()";
    local_50 = (void *)0x4b00000065;
    kj::Promise<void>::fork((Promise<void> *)&local_40);
    *(undefined1 *)&pMVar6[1].wrappers.table.rows.builder.pos = 1;
    pMVar6[1].wrappers.table.rows.builder.endPtr = (Entry *)local_40.ptr;
    pMVar6[1].wrappers.table.rows.builder.disposer = local_38;
  }
  node = local_90.ptr.field_1;
  *(int *)&pMVar6[1].wrappers.table.rows.builder.ptr =
       *(int *)&pMVar6[1].wrappers.table.rows.builder.ptr + 1;
  if ((local_90.ptr.isSet == true) &&
     (local_90.ptr.field_1 != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0))
  {
    local_90.ptr.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  local_80.disposer = (Disposer *)(pMVar6 + 1);
  local_80.ptr = pMVar6;
  membrane<capnp::_::(anonymous_namespace)::TestMembraneImpl>
            ((Client *)local_b8,
             (Own<capnp::_::(anonymous_namespace)::TestMembraneImpl,_std::nullptr_t> *)local_a0,
             &local_80);
  p_Var1 = *(_func_int **)((long)local_b8 + -0x18);
  local_70.hook.disposer = *(Disposer **)(local_b8 + (long)p_Var1);
  local_70.hook.ptr = *(ClientHook **)(p_Var1 + (long)&local_b0._vptr_Connection);
  *(undefined8 *)(p_Var1 + (long)&local_b0._vptr_Connection) = 0;
  TwoPartyClient::TwoPartyClient(&this->server,connection,&local_70,SERVER);
  pCVar5 = local_70.hook.ptr;
  if (local_70.hook.ptr != (ClientHook *)0x0) {
    local_70.hook.ptr = (ClientHook *)0x0;
    (**(local_70.hook.disposer)->_vptr_Disposer)
              (local_70.hook.disposer,
               (_func_int *)((long)&pCVar5->_vptr_ClientHook + (long)pCVar5->_vptr_ClientHook[-2]));
  }
  WVar3._vptr_WindowGetter = local_a8._vptr_WindowGetter;
  if (local_a8._vptr_WindowGetter != (_func_int **)0x0) {
    local_a8._vptr_WindowGetter = (_func_int **)0x0;
    (**(code **)*local_b0._vptr_Connection)
              (local_b0._vptr_Connection,
               (long)WVar3._vptr_WindowGetter + *(long *)(*WVar3._vptr_WindowGetter + -0x10));
  }
  pMVar6 = local_80.ptr;
  if (local_80.ptr != (MembranePolicy *)0x0) {
    local_80.ptr = (MembranePolicy *)0x0;
    (**(local_80.disposer)->_vptr_Disposer)
              (local_80.disposer,
               (_func_int *)
               ((long)&pMVar6->_vptr_MembranePolicy + (long)pMVar6->_vptr_MembranePolicy[-2]));
  }
  uVar4 = local_a0._8_8_;
  if ((TestMembraneImpl *)local_a0._8_8_ != (TestMembraneImpl *)0x0) {
    local_a0._8_8_ = (TestMembraneImpl *)0x0;
    (***(_func_int ***)local_a0._0_8_)(local_a0._0_8_,uVar4 + *(long *)(*(long *)uVar4 + -0x10));
  }
  CVar7 = TwoPartyClient::bootstrap((TwoPartyClient *)local_b8);
  (**(code **)(*local_b0._vptr_Connection + 0x20))
            (&local_60,local_b0._vptr_Connection,CVar7.hook.ptr);
  CVar2._vptr_Connection = local_b0._vptr_Connection;
  *(char **)&(this->membraned).field_0x8 = local_60;
  *(char **)&(this->membraned).field_0x10 = pcStack_58;
  pcStack_58 = (char *)0x0;
  (this->membraned)._vptr_Client =
       (_func_int **)&capnproto_test::capnp::test::TestMembrane::Client::typeinfo;
  if (local_b0._vptr_Connection != (_func_int **)0x0) {
    local_b0._vptr_Connection = (_func_int **)0x0;
    (**(code **)*(_func_int **)local_b8)
              (local_b8,(long)CVar2._vptr_Connection + *(long *)(*CVar2._vptr_Connection + -0x10));
  }
  return;
}

Assistant:

TestRpcEnv(kj::Maybe<kj::Promise<void>> revokePromise = kj::none)
      : waitScope(loop),
        pipe(kj::newTwoWayPipe()),
        client(*pipe.ends[0]),
        server(*pipe.ends[1],
               membrane(kj::heap<TestMembraneImpl>(),
                        kj::refcounted<MembranePolicyImpl>(kj::mv(revokePromise))),
               rpc::twoparty::Side::SERVER),
        membraned(client.bootstrap().castAs<test::TestMembrane>()) {}